

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_peer_connection.cpp
# Opt level: O1

string * __thiscall
libtorrent::aux::escape_file_path_abi_cxx11_
          (string *__return_storage_ptr__,aux *this,file_storage *storage,file_index_t index)

{
  undefined4 in_register_0000000c;
  string *save_path;
  string_view str;
  string new_path;
  string local_60;
  string local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"","",CONCAT44(in_register_0000000c,index.m_val));
  save_path = &local_60;
  file_storage::file_path(&local_40,(file_storage *)this,(file_index_t)(int)storage,save_path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  str._M_str = (char *)save_path;
  str._M_len = (size_t)local_40._M_dataplus._M_p;
  escape_path_abi_cxx11_(__return_storage_ptr__,(libtorrent *)local_40._M_string_length,str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string escape_file_path(file_storage const& storage, file_index_t index)
{
	std::string new_path { storage.file_path(index) };
#ifdef TORRENT_WINDOWS
	convert_path_to_posix(new_path);
#endif
	return escape_path(new_path);
}